

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uint uVar1;
  uchar *__ptr;
  long lVar2;
  float *pfVar3;
  uint uVar4;
  long lVar5;
  float *pfVar6;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  
  __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
  if (__ptr == (uchar *)0x0) {
    stbi__g_failure_reason = "unknown image type";
    return (float *)0x0;
  }
  uVar1 = *x;
  uVar11 = *y;
  if (req_comp == 0) {
    req_comp = *comp;
  }
  if (-1 < (int)(uVar11 | uVar1)) {
    if ((uVar11 != 0) && (pfVar3 = (float *)0x0, (int)(0x7fffffff / (ulong)uVar11) < (int)uVar1))
    goto LAB_00163bf8;
    uVar4 = uVar11 * uVar1;
    if (-1 < (int)(req_comp | uVar4)) {
      if ((req_comp == 0) ||
         ((pfVar3 = (float *)0x0, (int)uVar4 <= (int)(0x7fffffff / (ulong)(uint)req_comp) &&
          (req_comp * uVar4 < 0x20000000)))) {
        pfVar3 = (float *)malloc((long)(int)(uVar4 * req_comp * 4));
      }
      goto LAB_00163bf8;
    }
  }
  pfVar3 = (float *)0x0;
LAB_00163bf8:
  if (pfVar3 == (float *)0x0) {
    free(__ptr);
    stbi__g_failure_reason = "outofmem";
    return (float *)0x0;
  }
  uVar4 = req_comp - (uint)((req_comp & 1U) == 0);
  uVar11 = uVar11 * uVar1;
  lVar5 = (long)req_comp;
  uVar9 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    uVar10 = 0;
    pfVar6 = pfVar3;
    puVar7 = __ptr;
    do {
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          fVar12 = powf((float)puVar7[uVar8] / 255.0,stbi__l2h_gamma);
          pfVar6[uVar8] = fVar12 * stbi__l2h_scale;
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      uVar10 = uVar10 + 1;
      pfVar6 = pfVar6 + lVar5;
      puVar7 = puVar7 + lVar5;
    } while (uVar10 != uVar9);
  }
  if ((req_comp & 1U) == 0 && 0 < (int)uVar11) {
    lVar2 = (long)(int)uVar4;
    do {
      pfVar3[lVar2] = (float)__ptr[lVar2] / 255.0;
      lVar2 = lVar2 + lVar5;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  free(__ptr);
  return pfVar3;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}